

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ManComputeMapping(Mf_Man_t *p)

{
  uint *__src;
  ushort uVar1;
  uint uVar2;
  Mf_Obj_t *pMVar3;
  Jf_Par_t *pJVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  char *pTitle;
  uint *pCut;
  ushort uVar15;
  short sVar16;
  ulong uVar17;
  uint *pCut_00;
  int iVar18;
  float fVar19;
  float fVar20;
  undefined1 local_338 [776];
  
  pGVar9 = p->pGia;
  if (0 < pGVar9->nObjs) {
    uVar17 = 0;
    do {
      if ((~*(uint *)(pGVar9->pObjs + uVar17) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar9->pObjs + uVar17)) {
        pMVar3 = p->pLfObjs;
        uVar10 = pMVar3[uVar17].iCutSet >> 0x10;
        if (((int)uVar10 < 0) || ((p->vPages).nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar6 = -1;
        puVar13 = (uint *)((ulong)((pMVar3[uVar17].iCutSet & 0xffffU) << 2) +
                          (long)(p->vPages).pArray[uVar10]);
        if ((p->fUseEla != 0) && (0xffff < *(uint *)&pMVar3[uVar17].field_0xc)) {
          iVar6 = Mf_CutDeref_rec(p,(int *)(puVar13 + 1));
        }
        __src = puVar13 + 1;
        uVar10 = 1000000000;
        if ((int)*puVar13 < 1) {
          pCut = (uint *)0x0;
          fVar20 = 1e+09;
        }
        else {
          iVar18 = 0;
          fVar20 = 1e+09;
          pCut = (uint *)0x0;
          uVar12 = 0;
          pCut_00 = __src;
          do {
            uVar2 = *pCut_00;
            uVar11 = uVar2 & 0x1f;
            if ((uVar11 == 1) && (uVar17 == pCut_00[1])) {
              __assert_fail("!Mf_CutIsTriv(pCut, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,0x5ff,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
            }
            pJVar4 = p->pPars;
            if (pJVar4->nLutSize < (int)uVar11) {
              __assert_fail("Mf_CutSize(pCut) <= p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,0x600,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
            }
            if (p->fUseEla == 0) {
              if (uVar11 == 0) {
                uVar12 = 1;
                fVar19 = 0.0;
              }
              else {
                fVar19 = 0.0;
                uVar14 = 0;
                uVar12 = 0;
                do {
                  uVar15 = *(ushort *)&p->pLfObjs[(int)pCut_00[uVar14 + 1]].field_0xc;
                  uVar5 = (uint)uVar15;
                  if (uVar15 < uVar12) {
                    uVar5 = uVar12;
                  }
                  uVar12 = uVar5;
                  fVar19 = fVar19 + p->pLfObjs[(int)pCut_00[uVar14 + 1]].Flow;
                  uVar14 = uVar14 + 1;
                } while ((uVar2 & 0x1f) != uVar14);
                uVar12 = uVar12 + 1;
              }
              iVar7 = 0;
              if (1 < uVar11) {
                if (pJVar4->fGenCnf == 0) {
                  if (pJVar4->fOptEdge == 0) {
                    iVar7 = 1;
                  }
                  else {
                    iVar7 = uVar11 + pJVar4->nAreaTuner;
                  }
                }
                else {
                  if ((p->vCnfSizes).nSize <= (int)(uVar2 >> 6)) goto LAB_006e44e1;
                  iVar7 = (p->vCnfSizes).pArray[uVar2 >> 6];
                }
              }
              fVar19 = fVar19 + (float)iVar7;
            }
            else {
              iVar7 = Mf_CutRef_rec(p,(int *)pCut_00);
              iVar8 = Mf_CutDeref_rec(p,(int *)pCut_00);
              if (iVar7 != iVar8) {
                __assert_fail("Ela1 == Ela2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                              ,0x5e2,"int Mf_CutAreaDerefed(Mf_Man_t *, int *)");
              }
              fVar19 = (float)iVar7;
            }
            if (pCut == (uint *)0x0) {
LAB_006e42b4:
              pCut = pCut_00;
              fVar20 = fVar19;
              uVar10 = uVar12;
            }
            else if ((fVar19 < fVar20) ||
                    (((fVar20 == fVar19 && (!NAN(fVar20) && !NAN(fVar19))) && (uVar12 < uVar10))))
            goto LAB_006e42b4;
            iVar18 = iVar18 + 1;
            pCut_00 = pCut_00 + (ulong)(*pCut_00 & 0x1f) + 1;
          } while (iVar18 < (int)*puVar13);
        }
        sVar16 = (short)uVar10;
        if (pCut == (uint *)0x0) {
          __assert_fail("pCutBest != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x605,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if ((p->fUseEla == 0) || (*(uint *)&pMVar3[uVar17].field_0xc < 0x10000)) {
          *(uint *)&pMVar3[uVar17].field_0xc = (uint)*(ushort *)&pMVar3[uVar17].field_0xc;
        }
        else {
          iVar6 = Mf_CutRef_rec(p,(int *)pCut);
        }
        if (iVar6 < -1) {
          __assert_fail("Value1 >= Value2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x60a,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->fUseEla != 0) {
          uVar10 = *pCut & 0x1f;
          if (uVar10 == 0) {
            sVar16 = 1;
          }
          else {
            uVar14 = 0;
            uVar15 = 0;
            do {
              uVar1 = *(ushort *)&p->pLfObjs[(int)pCut[uVar14 + 1]].field_0xc;
              if (uVar1 < uVar15) {
                uVar1 = uVar15;
              }
              uVar15 = uVar1;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
            sVar16 = uVar15 + 1;
          }
          if (((1 < uVar10) && (p->pPars->fGenCnf != 0)) &&
             ((p->vCnfSizes).nSize <= (int)(*pCut >> 6))) {
LAB_006e44e1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
        }
        *(short *)&pMVar3[uVar17].field_0xc = sVar16;
        pMVar3[uVar17].Flow = fVar20 / p->pLfObjs[uVar17].nFlowRefs;
        if (pCut <= puVar13) {
          __assert_fail("pCuts < pCut",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x2b6,"void Mf_ObjSetBestCut(int *, int *)");
        }
        if (__src < pCut) {
          uVar10 = *pCut;
          uVar14 = ((long)pCut - (long)__src) * 0x40000000 >> 0x1e & 0xfffffffffffffffc;
          memcpy(local_338,__src,uVar14);
          memmove(__src,pCut,(ulong)(uVar10 & 0x1f) * 4 + 4);
          memcpy(__src + (ulong)(uVar10 & 0x1f) + 1,local_338,uVar14);
        }
      }
      uVar17 = uVar17 + 1;
      pGVar9 = p->pGia;
    } while ((long)uVar17 < (long)pGVar9->nObjs);
  }
  Mf_ManSetMapRefs(p);
  if (p->fUseEla == 0) {
    pTitle = "Area ";
    if (p->Iter == 0) {
      pTitle = "Delay";
    }
  }
  else {
    pTitle = "Ela  ";
  }
  Mf_ManPrintStats(p,pTitle);
  return;
}

Assistant:

void Mf_ManComputeMapping( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjComputeBestCut( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}